

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall Runtime::popVarEnv(Runtime *this)

{
  VarEnv *this_00;
  _Fwd_list_node_base *p_Var1;
  
  p_Var1 = (this->varEnvs).super__Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>._M_impl._M_head
           ._M_next;
  this_00 = (VarEnv *)p_Var1[1]._M_next;
  if (this_00 != (VarEnv *)0x0) {
    VarEnv::~VarEnv(this_00);
    operator_delete(this_00);
    p_Var1 = (this->varEnvs).super__Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>._M_impl.
             _M_head._M_next;
  }
  (this->varEnvs).super__Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>._M_impl._M_head._M_next
       = p_Var1->_M_next;
  operator_delete(p_Var1);
  return;
}

Assistant:

void Runtime::popVarEnv() {
    if ((*(varEnvs.begin())) != NULL) {
        delete (*(varEnvs.begin()));
    }
    varEnvs.pop_front();
}